

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O1

void __thiscall
LongReadsRecruiter::simple_thread_reads(LongReadsRecruiter *this,int min_count,int min_bp)

{
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  *this_00;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> *matches;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pPVar4;
  long lVar5;
  pointer pvVar6;
  uint64_t uVar7;
  LongReadsRecruiter *pLVar8;
  LongReadsRecruiter *this_01;
  long lVar9;
  pointer ppVar10;
  int64_t pstart;
  int64_t pend;
  long local_70;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_68;
  LongReadsRecruiter *local_50;
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  *local_48;
  pointer local_40;
  long local_38;
  
  this_00 = &this->read_threads;
  std::
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  ::_M_erase_at_end(this_00,(this->read_threads).
                            super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  local_48 = this_00;
  std::
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  ::resize(this_00,((long)(this->read_perfect_matches).
                          super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->read_perfect_matches).
                          super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar6 = (this->read_perfect_matches).
           super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this->read_perfect_matches).
                         super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
                 -0x5555555555555555)) {
    this_01 = (LongReadsRecruiter *)0x1;
    do {
      matches = pvVar6 + (long)this_01;
      local_50 = this_01;
      find_all_valid_blocks(&local_68,this_01,matches,min_count,min_bp);
      local_40 = local_68.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (local_68.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_68.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar9 = 0;
        ppVar10 = local_68.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          iVar1 = ppVar10->first;
          iVar2 = ppVar10->second;
          pPVar4 = (matches->super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar9 = ((long)pPVar4[iVar1].read_position - (long)pPVar4[iVar1].node_position) + lVar9;
          local_70 = lVar9;
          uVar7 = SequenceDistanceGraph::get_node_size
                            (this->sdg,
                             (matches->
                             super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>).
                             _M_impl.super__Vector_impl_data._M_start[iVar1].node);
          lVar5 = local_70;
          local_38 = uVar7 + lVar9;
          pPVar4 = (matches->super__Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar3 = pPVar4[iVar2].node_position;
          iVar2 = pPVar4[iVar2].read_position;
          std::vector<NodePosition,std::allocator<NodePosition>>::
          emplace_back<long_const&,long&,long&>
                    ((vector<NodePosition,std::allocator<NodePosition>> *)
                     ((local_48->
                      super__Vector_base<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (long)this_01),
                     &pPVar4[iVar1].node,&local_70,&local_38);
          lVar9 = (lVar5 + iVar3) - (long)iVar2;
          ppVar10 = ppVar10 + 1;
        } while (ppVar10 != local_40);
      }
      if (local_68.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      this_01 = (LongReadsRecruiter *)((long)&local_50->sdg + 1);
      pvVar6 = (this->read_perfect_matches).
               super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar8 = (LongReadsRecruiter *)
               (((long)(this->read_perfect_matches).
                       super__Vector_base<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>,_std::allocator<std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
               -0x5555555555555555);
    } while (this_01 <= pLVar8 && (long)pLVar8 - (long)this_01 != 0);
  }
  return;
}

Assistant:

void LongReadsRecruiter::simple_thread_reads(int min_count,int min_bp) {
    read_threads.clear();
    read_threads.resize(read_perfect_matches.size());
    for (auto rid=1;rid<read_perfect_matches.size();++rid){
        int64_t thread_offset=0;//offset between thread and read, computed on last block's position vs. its last match
        const auto & matches=read_perfect_matches[rid];
        for (auto nb:find_all_valid_blocks(matches,min_count,min_bp)) {
            int64_t pstart=matches[nb.first].read_position-matches[nb.first].node_position+thread_offset;
            int64_t pend=pstart+sdg.get_node_size(matches[nb.first].node);
            thread_offset=pstart+matches[nb.second].node_position-matches[nb.second].read_position;
            read_threads[rid].emplace_back(matches[nb.first].node, pstart, pend);
        }
    }
}